

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O2

SampledSpectrum __thiscall
pbrt::SimplePathIntegrator::Li
          (SimplePathIntegrator *this,RayDifferential *ray,SampledWavelengths *lambda,
          SamplerHandle *sampler,ScratchBuffer *scratchBuffer,VisibleSurface *visibleSurface)

{
  Normal3f *pNVar1;
  Vector3f *this_00;
  undefined4 uVar2;
  undefined4 uVar4;
  TaggedPointer<pbrt::PointLight,pbrt::DistantLight,pbrt::ProjectionLight,pbrt::GoniometricLight,pbrt::SpotLight,pbrt::DiffuseAreaLight,pbrt::UniformInfiniteLight,pbrt::ImageInfiniteLight,pbrt::PortalImageInfiniteLight>
  *pTVar3;
  undefined1 auVar5 [16];
  Vector3f woRender;
  Vector3f wiRender;
  undefined1 auVar6 [32];
  undefined1 auVar7 [16];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  Interaction *pIVar25;
  SimplePathIntegrator *pSVar26;
  undefined1 auVar27 [20];
  bool bVar28;
  int iVar29;
  ShapeIntersection *this_01;
  SampledLight *pSVar30;
  ShapeIntersection *pSVar31;
  byte bVar32;
  LightHandle *light;
  type tVar36;
  Point2f PVar38;
  TaggedPointer<pbrt::PointLight,pbrt::DistantLight,pbrt::ProjectionLight,pbrt::GoniometricLight,pbrt::SpotLight,pbrt::DiffuseAreaLight,pbrt::UniformInfiniteLight,pbrt::ImageInfiniteLight,pbrt::PortalImageInfiniteLight>
  *this_02;
  int iVar33;
  bool bVar34;
  Float FVar35;
  type tVar37;
  undefined1 auVar40 [16];
  undefined8 uVar39;
  undefined8 uVar69;
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar48 [64];
  undefined1 extraout_var [56];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 extraout_var_01 [56];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 extraout_var_04 [56];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined8 uVar72;
  undefined8 uVar73;
  undefined1 in_ZMM1 [64];
  undefined1 auVar74 [56];
  Vector3<float> VVar75;
  Vector3f woRender_00;
  Vector3f VVar76;
  Vector3f wiRender_00;
  SampledSpectrum SVar77;
  anon_class_16_2_2793a994 func;
  SampledSpectrum local_388;
  undefined8 uStack_378;
  undefined8 uStack_370;
  Tuple3<pbrt::Vector3,_float> local_368;
  undefined1 local_358 [16];
  SampledSpectrum *pSStack_348;
  SampledSpectrum *pSStack_340;
  SampledSpectrum f;
  Interval<float> local_328;
  undefined1 local_320 [16];
  undefined8 local_310;
  SimplePathIntegrator *local_300;
  Vector3f wi;
  SampledSpectrum L;
  LightLiSample ls;
  SampledSpectrum local_210;
  SampledSpectrum local_200;
  SampledSpectrum local_1f0;
  optional<pbrt::SampledLight> sampledLight;
  uintptr_t local_1c8;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_1c0;
  BSDF bsdf;
  undefined4 uStack_154;
  undefined4 uStack_150;
  SampledSpectrum beta;
  optional<pbrt::ShapeIntersection> si;
  undefined1 auVar63 [64];
  undefined1 auVar70 [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  float fVar71;
  
  SampledSpectrum::SampledSpectrum(&L,0.0);
  SampledSpectrum::SampledSpectrum(&beta,1.0);
  this_00 = &(ray->super_Ray).d;
  iVar33 = 0;
  bVar32 = 1;
  local_300 = this;
  do {
    pSVar26 = local_300;
    bVar28 = SampledSpectrum::operator_cast_to_bool(&beta);
    if (!bVar28) {
      return (SampledSpectrum)(undefined1  [16])L.values.values;
    }
    auVar41 = ZEXT464(0x7f800000);
    Integrator::Intersect(&si,(Integrator *)pSVar26,&ray->super_Ray,INFINITY);
    auVar70 = auVar41._8_56_;
    if (si.set == false) {
      if ((pSVar26->sampleLights != true) || ((bVar32 & 1) != 0)) {
        this_02 = (TaggedPointer<pbrt::PointLight,pbrt::DistantLight,pbrt::ProjectionLight,pbrt::GoniometricLight,pbrt::SpotLight,pbrt::DiffuseAreaLight,pbrt::UniformInfiniteLight,pbrt::ImageInfiniteLight,pbrt::PortalImageInfiniteLight>
                   *)(local_300->super_RayIntegrator).super_ImageTileIntegrator.super_Integrator.
                     infiniteLights.
                     super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                     _M_impl.super__Vector_impl_data._M_start;
        pTVar3 = *(TaggedPointer<pbrt::PointLight,pbrt::DistantLight,pbrt::ProjectionLight,pbrt::GoniometricLight,pbrt::SpotLight,pbrt::DiffuseAreaLight,pbrt::UniformInfiniteLight,pbrt::ImageInfiniteLight,pbrt::PortalImageInfiniteLight>
                   **)((long)&(local_300->super_RayIntegrator).super_ImageTileIntegrator.
                              super_Integrator.infiniteLights.
                              super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>
                              ._M_impl.super__Vector_impl_data + 8);
        while( true ) {
          auVar70 = in_ZMM1._8_56_;
          auVar74 = auVar41._8_56_;
          if (this_02 == pTVar3) break;
          func.lambda = lambda;
          func.ray = &ray->super_Ray;
          SVar77 = TaggedPointer<pbrt::PointLight,pbrt::DistantLight,pbrt::ProjectionLight,pbrt::GoniometricLight,pbrt::SpotLight,pbrt::DiffuseAreaLight,pbrt::UniformInfiniteLight,pbrt::ImageInfiniteLight,pbrt::PortalImageInfiniteLight>
                   ::
                   Dispatch<pbrt::LightHandle::Le(pbrt::Ray_const&,pbrt::SampledWavelengths_const&)const::_lambda(auto:1)_1_>
                             (this_02,func);
          auVar41._8_56_ = auVar70;
          auVar41._0_8_ = SVar77.values.values._8_8_;
          auVar58._0_8_ = SVar77.values.values._0_8_;
          auVar58._8_56_ = auVar74;
          f.values.values = (array<float,_4>)vmovlhps_avx(auVar58._0_16_,auVar41._0_16_);
          auVar74 = ZEXT856(f.values.values._8_8_);
          SVar77 = SampledSpectrum::operator*(&beta,&f);
          auVar20._8_56_ = auVar70;
          auVar20._0_8_ = SVar77.values.values._8_8_;
          auVar59._0_8_ = SVar77.values.values._0_8_;
          auVar59._8_56_ = auVar74;
          bsdf._0_16_ = vmovlhps_avx(auVar59._0_16_,auVar20._0_16_);
          auVar74 = ZEXT856(bsdf.bxdf.
                            super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                            .bits);
          SVar77 = SampledWavelengths::PDF(lambda);
          auVar21._8_56_ = auVar70;
          auVar21._0_8_ = SVar77.values.values._8_8_;
          auVar60._0_8_ = SVar77.values.values._0_8_;
          auVar60._8_56_ = auVar74;
          local_358 = vmovlhps_avx(auVar60._0_16_,auVar21._0_16_);
          auVar74 = ZEXT856(local_358._8_8_);
          SVar77 = SafeDiv((SampledSpectrum *)&bsdf,(SampledSpectrum *)local_358);
          in_ZMM1._8_56_ = auVar70;
          in_ZMM1._0_8_ = SVar77.values.values._8_8_;
          auVar61._0_8_ = SVar77.values.values._0_8_;
          auVar61._8_56_ = auVar74;
          auVar5 = vmovlhps_avx(auVar61._0_16_,in_ZMM1._0_16_);
          auVar41 = ZEXT1664(auVar5);
          ls.L.values.values[0] = auVar5._0_4_;
          ls.L.values.values[1] = auVar5._4_4_;
          ls.L.values.values[2] = auVar5._8_4_;
          ls.L.values.values[3] = auVar5._12_4_;
          SampledSpectrum::operator+=(&L,&ls.L);
          this_02 = this_02 + 8;
        }
      }
      bVar28 = true;
    }
    else {
      this_01 = pstd::optional<pbrt::ShapeIntersection>::value(&si);
      auVar74 = in_ZMM1._8_56_;
      if ((pSVar26->sampleLights != true) || ((bVar32 & 1) != 0)) {
        VVar75 = Tuple3<pbrt::Vector3,_float>::operator-
                           (&this_00->super_Tuple3<pbrt::Vector3,_float>);
        auVar42._0_8_ = VVar75.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar42._8_56_ = auVar70;
        uVar39 = vmovlps_avx(auVar42._0_16_);
        local_388.values.values[2] = VVar75.super_Tuple3<pbrt::Vector3,_float>.z;
        local_388.values.values[0] = (float)(int)uVar39;
        local_388.values.values[1] = (float)(int)((ulong)uVar39 >> 0x20);
        SVar77 = SurfaceInteraction::Le(&this_01->intr,(Vector3f *)&local_388,lambda);
        auVar8._8_56_ = auVar74;
        auVar8._0_8_ = SVar77.values.values._8_8_;
        auVar43._0_8_ = SVar77.values.values._0_8_;
        auVar43._8_56_ = auVar70;
        f.values.values = (array<float,_4>)vmovlhps_avx(auVar43._0_16_,auVar8._0_16_);
        auVar70 = ZEXT856(f.values.values._8_8_);
        SVar77 = SampledSpectrum::operator*(&beta,&f);
        auVar9._8_56_ = auVar74;
        auVar9._0_8_ = SVar77.values.values._8_8_;
        auVar44._0_8_ = SVar77.values.values._0_8_;
        auVar44._8_56_ = auVar70;
        bsdf._0_16_ = vmovlhps_avx(auVar44._0_16_,auVar9._0_16_);
        auVar70 = ZEXT856(bsdf.bxdf.
                          super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                          .bits);
        SVar77 = SampledWavelengths::PDF(lambda);
        auVar10._8_56_ = auVar74;
        auVar10._0_8_ = SVar77.values.values._8_8_;
        auVar45._0_8_ = SVar77.values.values._0_8_;
        auVar45._8_56_ = auVar70;
        local_358 = vmovlhps_avx(auVar45._0_16_,auVar10._0_16_);
        auVar70 = ZEXT856(local_358._8_8_);
        SVar77 = SafeDiv((SampledSpectrum *)&bsdf,(SampledSpectrum *)local_358);
        in_ZMM1._8_56_ = auVar74;
        in_ZMM1._0_8_ = SVar77.values.values._8_8_;
        auVar46._0_8_ = SVar77.values.values._0_8_;
        auVar46._8_56_ = auVar70;
        auVar5 = vmovlhps_avx(auVar46._0_16_,in_ZMM1._0_16_);
        auVar70 = ZEXT856(auVar5._8_8_);
        ls.L.values.values[0] = auVar5._0_4_;
        ls.L.values.values[1] = auVar5._4_4_;
        ls.L.values.values[2] = auVar5._8_4_;
        ls.L.values.values[3] = auVar5._12_4_;
        SampledSpectrum::operator+=(&L,&ls.L);
      }
      pSVar26 = local_300;
      iVar29 = iVar33 + 1;
      bVar28 = true;
      bVar34 = iVar33 != local_300->maxDepth;
      iVar33 = iVar29;
      if (bVar34) {
        local_1c0.bits =
             (local_300->super_RayIntegrator).super_ImageTileIntegrator.camera.
             super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
             .bits;
        local_1c8 = (sampler->
                    super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                    ).bits;
        SurfaceInteraction::GetBSDF
                  (&bsdf,&this_01->intr,ray,lambda,(CameraHandle *)&local_1c0,scratchBuffer,
                   (SamplerHandle)&local_1c8);
        if (((undefined1  [16])bsdf._0_16_ & (undefined1  [16])0xffffffffffff) ==
            (undefined1  [16])0x0) {
          pSVar31 = pstd::optional<pbrt::ShapeIntersection>::value(&si);
          SurfaceInteraction::SkipIntersection(&this_01->intr,ray,pSVar31->tHit);
          bVar28 = false;
        }
        else {
          VVar75 = Tuple3<pbrt::Vector3,_float>::operator-
                             (&this_00->super_Tuple3<pbrt::Vector3,_float>);
          local_368.z = VVar75.super_Tuple3<pbrt::Vector3,_float>.z;
          auVar47._0_8_ = VVar75.super_Tuple3<pbrt::Vector3,_float>._0_8_;
          auVar47._8_56_ = auVar70;
          local_368._0_8_ = vmovlps_avx(auVar47._0_16_);
          if (pSVar26->sampleLights == true) {
            FVar35 = TaggedPointer<pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::PMJ02BNSampler,pbrt::RandomSampler,pbrt::SobolSampler,pbrt::StratifiedSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                     ::Dispatch<pbrt::SamplerHandle::Get1D()::_lambda(auto:1)_1_>
                               ((TaggedPointer<pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::PMJ02BNSampler,pbrt::RandomSampler,pbrt::SobolSampler,pbrt::StratifiedSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                                 *)sampler);
            UniformLightSampler::Sample(&sampledLight,&this->lightSampler,FVar35);
            if (sampledLight.set == true) {
              PVar38 = TaggedPointer<pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::PMJ02BNSampler,pbrt::RandomSampler,pbrt::SobolSampler,pbrt::StratifiedSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                       ::Dispatch<pbrt::SamplerHandle::Get2D()::_lambda(auto:1)_1_>
                                 ((TaggedPointer<pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::PMJ02BNSampler,pbrt::RandomSampler,pbrt::SobolSampler,pbrt::StratifiedSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                                   *)sampler);
              pSVar30 = pstd::optional<pbrt::SampledLight>::value(&sampledLight);
              local_328 = (this_01->intr).super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
                          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z;
              pIVar25 = &(this_01->intr).super_Interaction;
              f.values.values[0] =
                   (pIVar25->pi).super_Point3<pbrt::Interval<float>_>.
                   super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
              f.values.values[1] =
                   (pIVar25->pi).super_Point3<pbrt::Interval<float>_>.
                   super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
              f.values.values[2] =
                   (pIVar25->pi).super_Point3<pbrt::Interval<float>_>.
                   super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
              f.values.values[3] =
                   (pIVar25->pi).super_Point3<pbrt::Interval<float>_>.
                   super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
              uVar2 = (this_01->intr).shading.n.super_Tuple3<pbrt::Normal3,_float>.x;
              uVar4 = (this_01->intr).shading.n.super_Tuple3<pbrt::Normal3,_float>.y;
              local_388.values.values = *(array<float,_4> *)(lambda->lambda).values;
              uStack_378 = *(undefined8 *)(lambda->pdf).values;
              uStack_370 = *(undefined8 *)((lambda->pdf).values + 2);
              local_320._12_4_ = uVar2;
              local_320._0_12_ =
                   (undefined1  [12])
                   (this_01->intr).super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>;
              local_310 = CONCAT44((this_01->intr).shading.n.super_Tuple3<pbrt::Normal3,_float>.z,
                                   uVar4);
              local_210.values.values[0] = 1.4013e-45;
              local_358._8_8_ = &local_200;
              local_358._0_8_ = &f;
              pSStack_348 = &local_388;
              pSStack_340 = &local_210;
              auVar5._8_8_ = extraout_XMM0_Qb;
              auVar5._0_4_ = PVar38.super_Tuple2<pbrt::Point2,_float>.x;
              auVar5._4_4_ = PVar38.super_Tuple2<pbrt::Point2,_float>.y;
              uVar39 = vmovlps_avx(auVar5);
              local_200.values.values[0] = (float)(int)uVar39;
              local_200.values.values[1] = (float)(int)((ulong)uVar39 >> 0x20);
              local_1f0.values.values._0_8_ =
                   (pSVar30->light).
                   super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
                   .bits;
              detail::DispatchSplit<9>::operator()(&ls,(DispatchSplit<9> *)&wi,&local_1f0);
              if ((0.0 < ls.pdf) && (bVar28 = SampledSpectrum::operator_cast_to_bool(&ls.L), bVar28)
                 ) {
                VVar76.super_Tuple3<pbrt::Vector3,_float>.z = local_368.z;
                VVar76.super_Tuple3<pbrt::Vector3,_float>.x = local_368.x;
                VVar76.super_Tuple3<pbrt::Vector3,_float>.y = local_368.y;
                wiRender.super_Tuple3<pbrt::Vector3,_float>.y =
                     ls.wi.super_Tuple3<pbrt::Vector3,_float>.y;
                wiRender.super_Tuple3<pbrt::Vector3,_float>.x =
                     ls.wi.super_Tuple3<pbrt::Vector3,_float>.x;
                wi.super_Tuple3<pbrt::Vector3,_float>.z = ls.wi.super_Tuple3<pbrt::Vector3,_float>.z
                ;
                wiRender.super_Tuple3<pbrt::Vector3,_float>.z =
                     ls.wi.super_Tuple3<pbrt::Vector3,_float>.z;
                auVar70 = SUB6456(ZEXT6064((undefined1  [60])0x0),4);
                auVar74 = ZEXT856(0);
                SVar77 = BSDF::f(&bsdf,VVar76,wiRender,Radiance);
                auVar11._8_56_ = auVar70;
                auVar11._0_8_ = SVar77.values.values._8_8_;
                auVar48._0_8_ = SVar77.values.values._0_8_;
                auVar48._8_56_ = auVar74;
                local_358 = vmovlhps_avx(auVar48._0_16_,auVar11._0_16_);
                tVar36 = AbsDot<float>(&wi,&(this_01->intr).shading.n);
                auVar74 = extraout_var;
                SVar77 = SampledSpectrum::operator*((SampledSpectrum *)local_358,tVar36);
                auVar12._8_56_ = auVar70;
                auVar12._0_8_ = SVar77.values.values._8_8_;
                auVar70 = auVar70._4_56_;
                auVar49._0_8_ = SVar77.values.values._0_8_;
                auVar49._8_56_ = auVar74;
                f.values.values = (array<float,_4>)vmovlhps_avx(auVar49._0_16_,auVar12._0_16_);
                auVar74 = ZEXT856(f.values.values._8_8_);
                bVar28 = SampledSpectrum::operator_cast_to_bool(&f);
                if ((bVar28) &&
                   (bVar28 = Integrator::Unoccluded
                                       ((Integrator *)pSVar26,(Interaction *)this_01,&ls.pLight),
                   bVar28)) {
                  SVar77 = SampledSpectrum::operator*(&beta,&f);
                  auVar13._8_56_ = auVar70;
                  auVar13._0_8_ = SVar77.values.values._8_8_;
                  auVar50._0_8_ = SVar77.values.values._0_8_;
                  auVar50._8_56_ = auVar74;
                  local_1f0.values.values =
                       (array<float,_4>)vmovlhps_avx(auVar50._0_16_,auVar13._0_16_);
                  auVar74 = ZEXT856(local_1f0.values.values._8_8_);
                  SVar77 = SampledSpectrum::operator*(&local_1f0,&ls.L);
                  auVar14._8_56_ = auVar70;
                  auVar14._0_8_ = SVar77.values.values._8_8_;
                  auVar51._0_8_ = SVar77.values.values._0_8_;
                  auVar51._8_56_ = auVar74;
                  local_388.values.values =
                       (array<float,_4>)vmovlhps_avx(auVar51._0_16_,auVar14._0_16_);
                  pSVar30 = pstd::optional<pbrt::SampledLight>::value(&sampledLight);
                  FVar35 = ls.pdf;
                  fVar71 = pSVar30->pdf;
                  auVar74 = (undefined1  [56])0x0;
                  SVar77 = SampledWavelengths::PDF(lambda);
                  auVar15._8_56_ = auVar70;
                  auVar15._0_8_ = SVar77.values.values._8_8_;
                  auVar52._0_8_ = SVar77.values.values._0_8_;
                  auVar52._8_56_ = auVar74;
                  local_210.values.values =
                       (array<float,_4>)vmovlhps_avx(auVar52._0_16_,auVar15._0_16_);
                  auVar74 = ZEXT856(0);
                  SVar77 = SampledSpectrum::operator*(&local_210,FVar35 * fVar71);
                  auVar16._8_56_ = auVar70;
                  auVar16._0_8_ = SVar77.values.values._8_8_;
                  auVar53._0_8_ = SVar77.values.values._0_8_;
                  auVar53._8_56_ = auVar74;
                  local_200.values.values =
                       (array<float,_4>)vmovlhps_avx(auVar53._0_16_,auVar16._0_16_);
                  auVar74 = ZEXT856(local_200.values.values._8_8_);
                  SVar77 = SafeDiv(&local_388,&local_200);
                  auVar17._8_56_ = auVar70;
                  auVar17._0_8_ = SVar77.values.values._8_8_;
                  auVar54._0_8_ = SVar77.values.values._0_8_;
                  auVar54._8_56_ = auVar74;
                  local_358 = vmovlhps_avx(auVar54._0_16_,auVar17._0_16_);
                  SampledSpectrum::operator+=(&L,(SampledSpectrum *)local_358);
                }
              }
            }
            pstd::optional<pbrt::SampledLight>::~optional(&sampledLight);
          }
          if (pSVar26->sampleBSDF == true) {
            FVar35 = TaggedPointer<pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::PMJ02BNSampler,pbrt::RandomSampler,pbrt::SobolSampler,pbrt::StratifiedSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                     ::Dispatch<pbrt::SamplerHandle::Get1D()::_lambda(auto:1)_1_>
                               ((TaggedPointer<pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::PMJ02BNSampler,pbrt::RandomSampler,pbrt::SobolSampler,pbrt::StratifiedSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                                 *)sampler);
            fVar71 = local_368.z;
            uVar69 = local_368._0_8_;
            auVar55._0_8_ =
                 TaggedPointer<pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::PMJ02BNSampler,pbrt::RandomSampler,pbrt::SobolSampler,pbrt::StratifiedSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                 ::Dispatch<pbrt::SamplerHandle::Get2D()::_lambda(auto:1)_1_>
                           ((TaggedPointer<pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::PMJ02BNSampler,pbrt::RandomSampler,pbrt::SobolSampler,pbrt::StratifiedSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                             *)sampler);
            uVar72 = local_368._0_8_;
            auVar55._8_56_ = extraout_var_00;
            uVar39 = vmovlps_avx(auVar55._0_16_);
            ls.L.values.values[0] = (float)uVar39;
            ls.L.values.values[1] = (float)((ulong)uVar39 >> 0x20);
            woRender_00.super_Tuple3<pbrt::Vector3,_float>.z = fVar71;
            local_368.x = (float)uVar69;
            local_368.y = SUB84(uVar69,4);
            woRender_00.super_Tuple3<pbrt::Vector3,_float>.x = local_368.x;
            woRender_00.super_Tuple3<pbrt::Vector3,_float>.y = local_368.y;
            in_ZMM1 = ZEXT6064((undefined1  [60])0x0) << 0x20;
            local_368._0_8_ = uVar72;
            BSDF::Sample_f((BSDFSample *)&f,&bsdf,woRender_00,FVar35,(Point2f *)&ls,Radiance,All);
            auVar70 = in_ZMM1._8_56_;
            if ((float)local_320._4_4_ <= 0.0) {
              bVar28 = true;
              goto LAB_0042c384;
            }
            tVar36 = AbsDot<float>((Vector3<float> *)&local_328,&(this_01->intr).shading.n);
            auVar74 = extraout_var_01;
            SVar77 = SampledSpectrum::operator*(&f,tVar36);
            auVar18._8_56_ = auVar70;
            auVar18._0_8_ = SVar77.values.values._8_8_;
            auVar56._0_8_ = SVar77.values.values._0_8_;
            auVar56._8_56_ = auVar74;
            local_358 = vmovlhps_avx(auVar56._0_16_,auVar18._0_16_);
            auVar74 = (undefined1  [56])0x0;
            SVar77 = SampledSpectrum::operator/((SampledSpectrum *)local_358,(Float)local_320._4_4_)
            ;
            auVar19._8_56_ = auVar70;
            auVar19._0_8_ = SVar77.values.values._8_8_;
            auVar57._0_8_ = SVar77.values.values._0_8_;
            auVar57._8_56_ = auVar74;
            auVar5 = vmovlhps_avx(auVar57._0_16_,auVar19._0_16_);
            ls.L.values.values[0] = auVar5._0_4_;
            ls.L.values.values[1] = auVar5._4_4_;
            ls.L.values.values[2] = auVar5._8_4_;
            ls.L.values.values[3] = auVar5._12_4_;
            SampledSpectrum::operator*=(&beta,&ls.L);
            auVar5 = local_320;
            Interaction::SpawnRay
                      ((RayDifferential *)&ls,(Interaction *)this_01,(Vector3f *)&local_328);
            uVar39 = CONCAT44(ls.L.values.values[1],ls.L.values.values[0]);
            uVar69 = CONCAT44(ls.L.values.values[3],ls.L.values.values[2]);
            uVar72 = CONCAT44(ls.wi.super_Tuple3<pbrt::Vector3,_float>.x,ls.L.values.values[3]);
            uVar73 = CONCAT44(ls.wi.super_Tuple3<pbrt::Vector3,_float>.z,
                              ls.wi.super_Tuple3<pbrt::Vector3,_float>.y);
            bVar32 = auVar5[8] >> 4;
          }
          else {
            local_388.values.values._0_12_ = ZEXT812(0);
            bVar28 = BSDF::HasReflection(&bsdf);
            if ((bVar28) && (bVar28 = BSDF::HasTransmission(&bsdf), bVar28)) {
              auVar62._0_8_ =
                   TaggedPointer<pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::PMJ02BNSampler,pbrt::RandomSampler,pbrt::SobolSampler,pbrt::StratifiedSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                   ::Dispatch<pbrt::SamplerHandle::Get2D()::_lambda(auto:1)_1_>
                             ((TaggedPointer<pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::PMJ02BNSampler,pbrt::RandomSampler,pbrt::SobolSampler,pbrt::StratifiedSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                               *)sampler);
              auVar62._8_56_ = extraout_var_02;
              uVar39 = vmovlps_avx(auVar62._0_16_);
              ls.L.values.values[0] = (float)uVar39;
              ls.L.values.values[1] = (float)((ulong)uVar39 >> 0x20);
              auVar70 = extraout_var_02;
              VVar76 = SampleUniformSphere((Point2f *)&ls);
              fVar71 = VVar76.super_Tuple3<pbrt::Vector3,_float>.z;
              auVar63._0_8_ = VVar76.super_Tuple3<pbrt::Vector3,_float>._0_8_;
              auVar63._8_56_ = auVar70;
              uVar39 = vmovlps_avx(auVar63._0_16_);
              FVar35 = 0.07957747;
              local_388.values.values[2] = fVar71;
              local_388.values.values[0] = (float)(int)uVar39;
              local_388.values.values[1] = (float)(int)((ulong)uVar39 >> 0x20);
            }
            else {
              auVar64._0_8_ =
                   TaggedPointer<pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::PMJ02BNSampler,pbrt::RandomSampler,pbrt::SobolSampler,pbrt::StratifiedSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                   ::Dispatch<pbrt::SamplerHandle::Get2D()::_lambda(auto:1)_1_>
                             ((TaggedPointer<pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::PMJ02BNSampler,pbrt::RandomSampler,pbrt::SobolSampler,pbrt::StratifiedSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                               *)sampler);
              auVar64._8_56_ = extraout_var_03;
              uVar39 = vmovlps_avx(auVar64._0_16_);
              ls.L.values.values[0] = (float)uVar39;
              ls.L.values.values[1] = (float)((ulong)uVar39 >> 0x20);
              auVar70 = extraout_var_03;
              VVar76 = SampleUniformHemisphere((Point2f *)&ls);
              auVar65._0_8_ = VVar76.super_Tuple3<pbrt::Vector3,_float>._0_8_;
              auVar65._8_56_ = auVar70;
              uVar39 = vmovlps_avx(auVar65._0_16_);
              local_388.values.values[2] = VVar76.super_Tuple3<pbrt::Vector3,_float>.z;
              local_388.values.values[0] = (float)(int)uVar39;
              local_388.values.values[1] = (float)(int)((ulong)uVar39 >> 0x20);
              bVar28 = BSDF::HasReflection(&bsdf);
              if (bVar28) {
                pNVar1 = &(this_01->intr).super_Interaction.n;
                tVar36 = Dot<float>((Vector3<float> *)&local_368,pNVar1);
                tVar37 = Dot<float>((Vector3<float> *)&local_388,pNVar1);
                if (0.0 <= tVar37 * tVar36) goto LAB_0042c1e5;
LAB_0042c247:
                auVar40._0_8_ = local_388.values.values._0_8_ ^ 0x8000000080000000;
                auVar40._8_4_ = 0x80000000;
                local_388.values.values[2] = -local_388.values.values[2];
                auVar40._12_4_ = 0x80000000;
                uVar39 = vmovlps_avx(auVar40);
                local_388.values.values[0] = (float)(int)uVar39;
                local_388.values.values[1] = (float)(int)((ulong)uVar39 >> 0x20);
                fVar71 = local_388.values.values[2];
              }
              else {
LAB_0042c1e5:
                bVar28 = BSDF::HasTransmission(&bsdf);
                if (bVar28) {
                  pNVar1 = &(this_01->intr).super_Interaction.n;
                  tVar36 = Dot<float>((Vector3<float> *)&local_368,pNVar1);
                  tVar37 = Dot<float>((Vector3<float> *)&local_388,pNVar1);
                  fVar71 = local_388.values.values[2];
                  if (0.0 < tVar37 * tVar36) {
                    goto LAB_0042c247;
                  }
                }
                else {
                  fVar71 = local_388.values.values[2];
                }
              }
              FVar35 = 0.15915494;
            }
            SVar77.values.values = local_388.values.values;
            woRender.super_Tuple3<pbrt::Vector3,_float>.z = local_368.z;
            woRender.super_Tuple3<pbrt::Vector3,_float>.x = local_368.x;
            woRender.super_Tuple3<pbrt::Vector3,_float>.y = local_368.y;
            auVar70 = SUB6456(ZEXT6064((undefined1  [60])0x0),4);
            auVar74 = ZEXT856(0);
            wiRender_00.super_Tuple3<pbrt::Vector3,_float>.z = fVar71;
            wiRender_00.super_Tuple3<pbrt::Vector3,_float>.x = local_388.values.values[0];
            wiRender_00.super_Tuple3<pbrt::Vector3,_float>.y = local_388.values.values[1];
            local_388.values.values = SVar77.values.values;
            SVar77 = BSDF::f(&bsdf,woRender,wiRender_00,Radiance);
            auVar22._8_56_ = auVar70;
            auVar22._0_8_ = SVar77.values.values._8_8_;
            auVar66._0_8_ = SVar77.values.values._0_8_;
            auVar66._8_56_ = auVar74;
            local_358 = vmovlhps_avx(auVar66._0_16_,auVar22._0_16_);
            tVar36 = AbsDot<float>((Vector3<float> *)&local_388,&(this_01->intr).shading.n);
            auVar74 = extraout_var_04;
            SVar77 = SampledSpectrum::operator*((SampledSpectrum *)local_358,tVar36);
            auVar23._8_56_ = auVar70;
            auVar23._0_8_ = SVar77.values.values._8_8_;
            auVar67._0_8_ = SVar77.values.values._0_8_;
            auVar67._8_56_ = auVar74;
            f.values.values = (array<float,_4>)vmovlhps_avx(auVar67._0_16_,auVar23._0_16_);
            auVar74 = (undefined1  [56])0x0;
            SVar77 = SampledSpectrum::operator/(&f,FVar35);
            auVar24._8_56_ = auVar70;
            auVar24._0_8_ = SVar77.values.values._8_8_;
            auVar68._0_8_ = SVar77.values.values._0_8_;
            auVar68._8_56_ = auVar74;
            auVar5 = vmovlhps_avx(auVar68._0_16_,auVar24._0_16_);
            ls.L.values.values[0] = auVar5._0_4_;
            ls.L.values.values[1] = auVar5._4_4_;
            ls.L.values.values[2] = auVar5._8_4_;
            ls.L.values.values[3] = auVar5._12_4_;
            SampledSpectrum::operator*=(&beta,&ls.L);
            Interaction::SpawnRay
                      ((RayDifferential *)&ls,(Interaction *)this_01,(Vector3f *)&local_388);
            uVar39 = CONCAT44(ls.L.values.values[1],ls.L.values.values[0]);
            uVar69 = CONCAT44(ls.L.values.values[3],ls.L.values.values[2]);
            uVar72 = CONCAT44(ls.wi.super_Tuple3<pbrt::Vector3,_float>.x,ls.L.values.values[3]);
            uVar73 = CONCAT44(ls.wi.super_Tuple3<pbrt::Vector3,_float>.z,
                              ls.wi.super_Tuple3<pbrt::Vector3,_float>.y);
            bVar32 = 0;
          }
          auVar27 = (undefined1  [20])ls.pLight._32_20_;
          (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar72;
          (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y =
               (float)(int)((ulong)uVar72 >> 0x20);
          *(undefined8 *)&(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z = uVar73;
          (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar39;
          (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.y =
               (float)(int)((ulong)uVar39 >> 0x20);
          *(undefined8 *)&(ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z = uVar69;
          (ray->super_Ray).medium.
          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
          .bits = (uintptr_t)
                  ls.light.
                  super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
                  .bits;
          auVar6._4_4_ = ls.pLight.time;
          auVar6._8_4_ = ls.pLight.wo.super_Tuple3<pbrt::Vector3,_float>.x;
          auVar6._0_4_ = ls.pLight.pi.super_Point3<pbrt::Interval<float>_>.
                         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high;
          auVar6._12_4_ = ls.pLight.wo.super_Tuple3<pbrt::Vector3,_float>.y;
          auVar6._16_4_ = ls.pLight.wo.super_Tuple3<pbrt::Vector3,_float>.z;
          auVar6._20_4_ = ls.pLight.n.super_Tuple3<pbrt::Normal3,_float>.x;
          auVar6._24_4_ = ls.pLight.n.super_Tuple3<pbrt::Normal3,_float>.y;
          auVar6._28_4_ = ls.pLight.n.super_Tuple3<pbrt::Normal3,_float>.z;
          *(undefined1 (*) [32])&(ray->ryOrigin).super_Tuple3<pbrt::Point3,_float>.y = auVar6;
          *(Interval<float> *)&ray->hasDifferentials =
               ls.pLight.pi.super_Point3<pbrt::Interval<float>_>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x;
          (ray->rxOrigin).super_Tuple3<pbrt::Point3,_float>.y =
               ls.pLight.pi.super_Point3<pbrt::Interval<float>_>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
          (ray->rxOrigin).super_Tuple3<pbrt::Point3,_float>.z =
               ls.pLight.pi.super_Point3<pbrt::Interval<float>_>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
          (ray->ryOrigin).super_Tuple3<pbrt::Point3,_float>.x =
               ls.pLight.pi.super_Point3<pbrt::Interval<float>_>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low;
          (ray->ryOrigin).super_Tuple3<pbrt::Point3,_float>.y =
               ls.pLight.pi.super_Point3<pbrt::Interval<float>_>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high;
          *(undefined8 *)&(ray->ryOrigin).super_Tuple3<pbrt::Point3,_float>.z = ls.pLight._24_8_;
          in_ZMM1 = ZEXT1664(auVar6._0_16_);
          ls.pLight._32_20_ = auVar27;
          ls.L.values.values[0] = SampledSpectrum::y(&beta,lambda);
          auVar7._12_4_ = 0;
          auVar7._0_4_ = f.values.values[1];
          auVar7._4_4_ = f.values.values[2];
          auVar7._8_4_ = f.values.values[3];
          f.values.values = (array<float,_4>)(auVar7 << 0x20);
          if (ls.L.values.values[0] < 0.0) {
            LogFatal<char_const(&)[15],char_const(&)[4],char_const(&)[15],float&,char_const(&)[4],float&>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/integrators.cpp"
                       ,0x214,"Check failed: %s >= %s with %s = %s, %s = %s",
                       (char (*) [15])"beta.y(lambda)",(char (*) [4])"0.f",
                       (char (*) [15])"beta.y(lambda)",(float *)&ls,(char (*) [4])"0.f",(float *)&f)
            ;
          }
          bVar28 = false;
        }
      }
    }
LAB_0042c384:
    pstd::optional<pbrt::ShapeIntersection>::~optional(&si);
    if (bVar28) {
      return (SampledSpectrum)L.values;
    }
  } while( true );
}

Assistant:

SampledSpectrum SimplePathIntegrator::Li(RayDifferential ray, SampledWavelengths &lambda,
                                         SamplerHandle sampler,
                                         ScratchBuffer &scratchBuffer,
                                         VisibleSurface *visibleSurface) const {
    SampledSpectrum L(0.f), beta(1.f);
    bool specularBounce = true;
    int depth = 0;

    while (beta) {
        // Find next _SimplePathIntegrator_ path vertex and accumulate contribution
        // Intersect _ray_ with scene
        pstd::optional<ShapeIntersection> si = Intersect(ray);

        // Account for infinite lights if ray has no intersection
        if (!si) {
            if (!sampleLights || specularBounce)
                for (const auto &light : infiniteLights)
                    L += SafeDiv(beta * light.Le(ray, lambda), lambda.PDF());
            break;
        }

        // Account for emsisive surface if light wasn't sampled
        SurfaceInteraction &isect = si->intr;
        if (!sampleLights || specularBounce)
            L += SafeDiv(beta * isect.Le(-ray.d, lambda), lambda.PDF());

        // End path if maximum depth reached
        if (depth++ == maxDepth)
            break;

        // Compute scattering functions and skip over medium boundaries
        BSDF bsdf = isect.GetBSDF(ray, lambda, camera, scratchBuffer, sampler);
        if (!bsdf) {
            isect.SkipIntersection(&ray, si->tHit);
            continue;
        }

        // Sample direct illumination if _sampleLights_ is true
        Vector3f wo = -ray.d;
        if (sampleLights) {
            pstd::optional<SampledLight> sampledLight =
                lightSampler.Sample(sampler.Get1D());
            if (sampledLight) {
                // Sample point on _sampledLight_ to estimate direct illumination
                Point2f uLight = sampler.Get2D();
                LightLiSample ls = sampledLight->light.SampleLi(isect, uLight, lambda);
                if (ls && ls.L) {
                    // Evaluate BSDF for light and possibly add scattered radiance
                    Vector3f wi = ls.wi;
                    SampledSpectrum f = bsdf.f(wo, wi) * AbsDot(wi, isect.shading.n);
                    if (f && Unoccluded(isect, ls.pLight))
                        L += SafeDiv(beta * f * ls.L,
                                     sampledLight->pdf * ls.pdf * lambda.PDF());
                }
            }
        }

        // Sample outoing direction at intersection to continue path
        if (sampleBSDF) {
            // Sample BSDF for new path direction
            Float u = sampler.Get1D();
            BSDFSample bs = bsdf.Sample_f(wo, u, sampler.Get2D());
            if (!bs)
                break;
            beta *= bs.f * AbsDot(bs.wi, isect.shading.n) / bs.pdf;
            specularBounce = bs.IsSpecular();
            ray = isect.SpawnRay(bs.wi);

        } else {
            // Uniformly sample sphere or hemisphere to get new path direction
            Float pdf;
            Vector3f wi;
            if (bsdf.HasReflection() && bsdf.HasTransmission()) {
                wi = SampleUniformSphere(sampler.Get2D());
                pdf = UniformSpherePDF();
            } else {
                wi = SampleUniformHemisphere(sampler.Get2D());
                pdf = UniformHemispherePDF();
                if (bsdf.HasReflection() && Dot(wo, isect.n) * Dot(wi, isect.n) < 0)
                    wi = -wi;
                else if (bsdf.HasTransmission() &&
                         Dot(wo, isect.n) * Dot(wi, isect.n) > 0)
                    wi = -wi;
            }
            beta *= bsdf.f(wo, wi) * AbsDot(wi, isect.shading.n) / pdf;
            specularBounce = false;
            ray = isect.SpawnRay(wi);
        }

        CHECK_GE(beta.y(lambda), 0.f);
        DCHECK(!IsInf(beta.y(lambda)));
    }
    return L;
}